

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

string * __thiscall
google::protobuf::UninterpretedOption::mutable_aggregate_value_abi_cxx11_(UninterpretedOption *this)

{
  string *psVar1;
  
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
  if (this->aggregate_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    this->aggregate_value_ = psVar1;
  }
  return this->aggregate_value_;
}

Assistant:

inline ::std::string* UninterpretedOption::mutable_aggregate_value() {
  set_has_aggregate_value();
  if (aggregate_value_ == &::google::protobuf::internal::kEmptyString) {
    aggregate_value_ = new ::std::string;
  }
  return aggregate_value_;
}